

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::AccessorPrimitiveFieldGenerator::GenerateHashCodeCode
          (AccessorPrimitiveFieldGenerator *this,Printer *printer)

{
  Type field_type;
  JavaType JVar1;
  LogMessage *other;
  char *text;
  LogFinisher local_49;
  LogMessage local_48;
  
  field_type = FieldDescriptor::type(this->descriptor_);
  JVar1 = GetJavaType(field_type);
  switch(JVar1) {
  case JAVATYPE_INT:
    text = "result = 31 * result + $name$_;\n";
    break;
  case JAVATYPE_LONG:
    text = "result = 31 * result + (int) ($name$_ ^ ($name$_ >>> 32));\n";
    break;
  case JAVATYPE_FLOAT:
    text = "result = 31 * result +\n    java.lang.Float.floatToIntBits($name$_);\n";
    break;
  case JAVATYPE_DOUBLE:
    text = 
    "{\n  long v = java.lang.Double.doubleToLongBits($name$_);\n  result = 31 * result + (int) (v ^ (v >>> 32));\n}\n"
    ;
    break;
  case JAVATYPE_BOOLEAN:
    text = "result = 31 * result + ($name$_ ? 1231 : 1237);\n";
    break;
  case JAVATYPE_STRING:
    text = "result = 31 * result + $name$_.hashCode();\n";
    break;
  case JAVATYPE_BYTES:
    text = "result = 31 * result + java.util.Arrays.hashCode($name$_);\n";
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_primitive_field.cc"
               ,0x2b1);
    other = internal::LogMessage::operator<<(&local_48,"unknown java type for primitive field");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
    return;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void AccessorPrimitiveFieldGenerator::
GenerateHashCodeCode(io::Printer* printer) const {
  switch (GetJavaType(descriptor_)) {
    // For all Java primitive types below, the hash codes match the
    // results of BoxedType.valueOf(primitiveValue).hashCode().
    case JAVATYPE_INT:
      printer->Print(variables_,
        "result = 31 * result + $name$_;\n");
      break;
    case JAVATYPE_LONG:
      printer->Print(variables_,
        "result = 31 * result + (int) ($name$_ ^ ($name$_ >>> 32));\n");
      break;
    case JAVATYPE_FLOAT:
      printer->Print(variables_,
        "result = 31 * result +\n"
        "    java.lang.Float.floatToIntBits($name$_);\n");
      break;
    case JAVATYPE_DOUBLE:
      printer->Print(variables_,
        "{\n"
        "  long v = java.lang.Double.doubleToLongBits($name$_);\n"
        "  result = 31 * result + (int) (v ^ (v >>> 32));\n"
        "}\n");
      break;
    case JAVATYPE_BOOLEAN:
      printer->Print(variables_,
        "result = 31 * result + ($name$_ ? 1231 : 1237);\n");
      break;
    case JAVATYPE_STRING:
      // Accessor style would guarantee $name$_ non-null
      printer->Print(variables_,
        "result = 31 * result + $name$_.hashCode();\n");
      break;
    case JAVATYPE_BYTES:
      // Accessor style would guarantee $name$_ non-null
      printer->Print(variables_,
        "result = 31 * result + java.util.Arrays.hashCode($name$_);\n");
      break;
    default:
      GOOGLE_LOG(ERROR) << "unknown java type for primitive field";
      break;
  }
}